

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphCG.cpp
# Opt level: O2

void __thiscall phaeton::GraphCodeGen::GraphCodeGen(GraphCodeGen *this,Sema *S,string *FuncName)

{
  _Rb_tree_header *p_Var1;
  
  CodeGen::CodeGen(&this->super_CodeGen,S,FuncName);
  (this->super_CodeGen).super_ASTVisitor._vptr_ASTVisitor = (_func_int **)&PTR_visitProgram_0015f108
  ;
  (this->Graphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Graphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->Graphs)._M_t._M_impl.super__Rb_tree_header;
  this->CurrentGraph = (GraphCGGraph *)0x0;
  (this->CurrentLegs).
  super__Vector_base<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>,_std::allocator<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CurrentLegs).
  super__Vector_base<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>,_std::allocator<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CurrentLegs).
  super__Vector_base<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>,_std::allocator<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->CurrentEnd = (GraphCGNode *)0x0;
  (this->Graphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Graphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Graphs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExprGraphs)._M_t._M_impl.super__Rb_tree_header;
  (this->ExprGraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExprGraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExprGraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ExprGraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ExprGraphs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

GraphCodeGen::GraphCodeGen(const Sema *S, const std::string &FuncName)
    : CodeGen(S, FuncName), CurrentGraph(nullptr), CurrentEnd(nullptr) {
  CurrentLegs.clear();
}